

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure_member.cpp
# Opt level: O0

void __thiscall
r_comp::StructureMember::StructureMember
          (StructureMember *this,_Read r,string *m,string *p,Iteration i)

{
  undefined4 in_register_00000084;
  Iteration in_R9D;
  Iteration i_local;
  string *p_local;
  string *m_local;
  _Read r_local;
  StructureMember *this_local;
  
  *(string **)&this->field_0x8 = m;
  this->_read = r;
  std::__cxx11::string::string((string *)&this->_class,(string *)CONCAT44(in_register_00000084,i));
  this->iteration = in_R9D;
  std::__cxx11::string::string((string *)&this->name,(string *)p);
  if ((code *)this->_read == Compiler::read_any &&
      ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = ANY;
  }
  else if ((code *)this->_read == Compiler::read_number &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = NUMBER;
  }
  else if ((code *)this->_read == Compiler::read_timestamp &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = TIMESTAMP;
  }
  else if ((code *)this->_read == Compiler::read_boolean &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = BOOLEAN;
  }
  else if ((code *)this->_read == Compiler::read_string &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = STRING;
  }
  else if ((code *)this->_read == Compiler::read_node &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = NODE_ID;
  }
  else if ((code *)this->_read == Compiler::read_device &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = DEVICE_ID;
  }
  else if ((code *)this->_read == Compiler::read_function &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = FUNCTION_ID;
  }
  else if ((code *)this->_read == Compiler::read_expression &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = ANY;
  }
  else if ((code *)this->_read == Compiler::read_set &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = SET;
  }
  else if ((code *)this->_read == Compiler::read_class &&
           ((code *)this->_read == (code *)0x0 || *(long *)&this->field_0x8 == 0)) {
    this->type = CLASS;
  }
  return;
}

Assistant:

StructureMember::StructureMember(_Read r,
                                 std::string m,
                                 std::string p,
                                 Iteration i): _read(r),
    _class(std::move(p)),
    iteration(i),
    name(std::move(m))
{
    if (_read == &Compiler::read_any) {
        type = ANY;
    } else if (_read == &Compiler::read_number) {
        type = NUMBER;
    } else if (_read == &Compiler::read_timestamp) {
        type = TIMESTAMP;
    } else if (_read == &Compiler::read_boolean) {
        type = BOOLEAN;
    } else if (_read == &Compiler::read_string) {
        type = STRING;
    } else if (_read == &Compiler::read_node) {
        type = NODE_ID;
    } else if (_read == &Compiler::read_device) {
        type = DEVICE_ID;
    } else if (_read == &Compiler::read_function) {
        type = FUNCTION_ID;
    } else if (_read == &Compiler::read_expression) {
        type = ANY;
    } else if (_read == &Compiler::read_set) {
        type = ReturnType::SET;
    } else if (_read == &Compiler::read_class) {
        type = ReturnType::CLASS;
    }
}